

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O1

void __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::put_back
          (input_stream_t<cfgfile::qstring_trait_t> *this,char_t ch)

{
  _Elt_pointer pQVar1;
  _Elt_pointer ppVar2;
  QChar local_1a;
  undefined8 local_18;
  pos_t pStack_10;
  
  ppVar2 = (this->m_prev_positions).c.
           super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 != (this->m_prev_positions).c.
                super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar2 == (this->m_prev_positions).c.
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar2 = (this->m_prev_positions).c.
               super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    local_18 = ppVar2[-1].m_column_number;
    pStack_10 = ppVar2[-1].m_line_number;
    local_1a.ucs = ch.ucs;
    std::
    deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
    ::pop_back(&(this->m_prev_positions).c);
    *(undefined4 *)&this->m_line_number = (undefined4)pStack_10;
    *(undefined4 *)((long)&this->m_line_number + 4) = local_18._4_4_;
    *(undefined4 *)&this->m_column_number = (undefined4)local_18;
    *(undefined4 *)((long)&this->m_column_number + 4) = local_18._4_4_;
    pQVar1 = (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pQVar1 == (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<QChar,std::allocator<QChar>>::_M_push_back_aux<QChar_const&>
                ((deque<QChar,std::allocator<QChar>> *)&this->m_returned_char,&local_1a);
    }
    else {
      pQVar1->ucs = local_1a.ucs;
      (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pQVar1 + 1;
    }
  }
  return;
}

Assistant:

void put_back( typename Trait::char_t ch )
	{
		if( !m_prev_positions.empty() )
		{
			const auto prev = m_prev_positions.top();
			m_prev_positions.pop();

			m_column_number = prev.m_column_number;
			m_line_number = prev.m_line_number;

			m_returned_char.push( ch );
		}
	}